

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_listener_listen(void *arg)

{
  int rv;
  nni_ws_listener *l;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  if ((*(byte *)((long)arg + 0x111) & 1) == 0) {
    if ((*(byte *)((long)arg + 0x110) & 1) == 0) {
      arg_local._4_4_ =
           nni_http_server_add_handler
                     (*(nni_http_server **)((long)arg + 0x50),
                      *(nni_http_handler **)((long)arg + 0x118));
      if (arg_local._4_4_ == NNG_OK) {
        arg_local._4_4_ = nni_http_server_start(*(nni_http_server **)((long)arg + 0x50));
        if (arg_local._4_4_ == NNG_OK) {
          *(undefined1 *)((long)arg + 0x110) = 1;
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
          arg_local._4_4_ = NNG_OK;
        }
        else {
          nni_http_server_del_handler
                    (*(nni_http_server **)((long)arg + 0x50),
                     *(nni_http_handler **)((long)arg + 0x118));
          nni_http_server_fini(*(nni_http_server **)((long)arg + 0x50));
          *(undefined8 *)((long)arg + 0x50) = 0;
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
        }
      }
      else {
        nni_http_server_fini(*(nni_http_server **)((long)arg + 0x50));
        *(undefined8 *)((long)arg + 0x50) = 0;
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
      }
    }
    else {
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
      arg_local._4_4_ = NNG_ESTATE;
    }
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
    arg_local._4_4_ = NNG_ECLOSED;
  }
  return arg_local._4_4_;
}

Assistant:

static int
ws_listener_listen(void *arg)
{
	nni_ws_listener *l = arg;
	int              rv;

	nni_mtx_lock(&l->mtx);
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ESTATE);
	}

	if ((rv = nni_http_server_add_handler(l->server, l->handler)) != 0) {
		nni_http_server_fini(l->server);
		l->server = NULL;
		nni_mtx_unlock(&l->mtx);
		return (rv);
	}

	if ((rv = nni_http_server_start(l->server)) != 0) {
		nni_http_server_del_handler(l->server, l->handler);
		nni_http_server_fini(l->server);
		l->server = NULL;
		nni_mtx_unlock(&l->mtx);
		return (rv);
	}

	l->started = true;

	nni_mtx_unlock(&l->mtx);
	return (0);
}